

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cdn.cc
# Opt level: O0

void __thiscall aliyun::Cdn::Cdn(Cdn *this,string *host,string *appid,string *secret)

{
  char *pcVar1;
  string *secret_local;
  string *appid_local;
  string *host_local;
  Cdn *this_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strdup(pcVar1);
  this->appid_ = pcVar1;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strdup(pcVar1);
  this->secret_ = pcVar1;
  pcVar1 = strdup("2014-11-11");
  this->version_ = pcVar1;
  this->region_id_ = (char *)0x0;
  this->use_tls_ = true;
  this->support_tls_ = true;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strdup(pcVar1);
  this->host_ = pcVar1;
  this->proxy_host_ = (char *)0x0;
  return;
}

Assistant:

Cdn::Cdn(std::string host, std::string appid, std::string secret) {
    appid_ = strdup(appid.c_str());
    secret_ = strdup(secret.c_str());
    version_ = strdup("2014-11-11");
    region_id_ = NULL;
    use_tls_ = true;
    support_tls_ = true;
    host_ = strdup(host.c_str());
    proxy_host_ = NULL;
  }